

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::dump_object(Dispatch_Engine *this,Boxed_Value *o)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_38;
  Boxed_Value *local_18;
  Boxed_Value *o_local;
  Dispatch_Engine *this_local;
  
  local_18 = o;
  o_local = (Boxed_Value *)this;
  bVar1 = Boxed_Value::is_const(o);
  pcVar3 = "";
  if (bVar1) {
    pcVar3 = "const ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  type_name_abi_cxx11_(&local_38,this,local_18);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::operator<<(poVar2,'\n');
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void dump_object(const Boxed_Value &o) const { std::cout << (o.is_const() ? "const " : "") << type_name(o) << '\n'; }